

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,double,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool,false,true>
               (interval_t *ldata,double *rdata,interval_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  double dVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  interval_t left;
  interval_t left_00;
  interval_t iVar10;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      dVar1 = *rdata;
      lVar6 = 8;
      do {
        iVar10.micros = *(int64_t *)((long)&ldata->months + lVar6);
        iVar10._0_8_ = *(undefined8 *)((long)ldata + lVar6 + -8);
        iVar10 = MultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                           (iVar10,dVar1);
        *(long *)((long)result_data + lVar6 + -8) = iVar10._0_8_;
        *(int64_t *)((long)&result_data->months + lVar6) = iVar10.micros;
        lVar6 = lVar6 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar3 = 0;
    uVar9 = 0;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar7 = 0xffffffffffffffff;
      }
      else {
        uVar7 = puVar2[uVar3];
      }
      uVar4 = uVar9 + 0x40;
      if (count <= uVar9 + 0x40) {
        uVar4 = count;
      }
      uVar5 = uVar4;
      if (uVar7 != 0) {
        uVar5 = uVar9;
        if (uVar7 == 0xffffffffffffffff) {
          if (uVar9 < uVar4) {
            dVar1 = *rdata;
            uVar7 = uVar9 << 4 | 8;
            do {
              left.micros = *(int64_t *)((long)&ldata->months + uVar7);
              left._0_8_ = *(undefined8 *)((long)ldata + (uVar7 - 8));
              iVar10 = MultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                                 (left,dVar1);
              *(long *)((long)result_data + (uVar7 - 8)) = iVar10._0_8_;
              *(int64_t *)((long)&result_data->months + uVar7) = iVar10.micros;
              uVar9 = uVar9 + 1;
              uVar7 = uVar7 + 0x10;
              uVar5 = uVar9;
            } while (uVar4 != uVar9);
          }
        }
        else if (uVar9 < uVar4) {
          uVar5 = uVar9 << 4 | 8;
          uVar8 = 0;
          do {
            if ((uVar7 >> (uVar8 & 0x3f) & 1) != 0) {
              left_00.micros = *(int64_t *)((long)&ldata->months + uVar5);
              left_00._0_8_ = *(undefined8 *)((long)ldata + (uVar5 - 8));
              iVar10 = MultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                                 (left_00,*rdata);
              *(long *)((long)result_data + (uVar5 - 8)) = iVar10._0_8_;
              *(int64_t *)((long)&result_data->months + uVar5) = iVar10.micros;
            }
            uVar8 = uVar8 + 1;
            uVar5 = uVar5 + 0x10;
          } while ((uVar9 - uVar4) + uVar8 != 0);
          uVar5 = uVar9 + uVar8;
        }
      }
      uVar3 = uVar3 + 1;
      uVar9 = uVar5;
    } while (uVar3 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}